

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O0

void __thiscall IRBuilderAsmJs::BuildConstantLoads(IRBuilderAsmJs *this)

{
  code *pcVar1;
  undefined4 constCount;
  Type byteOffset;
  RegOpnd *table_00;
  bool bVar2;
  anon_class_1_1_d201c1ad extraProcess;
  ValueType VVar3;
  JITTimeFunctionBody *this_00;
  undefined4 *puVar4;
  undefined1 local_58 [8];
  TypedSlotInfo info;
  Types type;
  int i;
  bool isOOPJIT;
  byte *table;
  Instr *pIStack_28;
  uint32 regAllocated;
  Instr *ldAsmJsEnvInstr;
  RegOpnd *asmJsEnvDstOpnd;
  Var *constTable;
  IRBuilderAsmJs *this_local;
  
  constTable = &this->m_tempAlloc;
  this_00 = Func::GetJITFunctionBody(this->m_func);
  asmJsEnvDstOpnd = (RegOpnd *)JITTimeFunctionBody::GetConstTable(this_00);
  ldAsmJsEnvInstr = (Instr *)BuildDstOpnd(this,1,TyVar);
  pIStack_28 = IR::Instr::New(LdAsmJsEnv,(Opnd *)ldAsmJsEnvInstr,this->m_func);
  AddInstr(this,pIStack_28,0xffffffff);
  bVar2 = AsmJsJITInfo::UsesHeapBuffer(this->m_asmFuncInfo);
  if (bVar2) {
    BuildHeapBufferReload(this,0xffffffff,true);
  }
  table_00 = asmJsEnvDstOpnd;
  if (asmJsEnvDstOpnd != (RegOpnd *)0x0) {
    table._4_4_ = 8;
    extraProcess.isOOPJIT = Func::IsOOPJIT(this->m_func);
    for (info.constSrcByteOffset = 0; (int)info.constSrcByteOffset < 5;
        info.constSrcByteOffset = info.constSrcByteOffset + 1) {
      info.byteOffset = info.constSrcByteOffset;
      AsmJsJITInfo::GetTypedSlotInfo
                ((TypedSlotInfo *)local_58,this->m_asmFuncInfo,info.constSrcByteOffset);
      byteOffset = info.tmpCount;
      constCount = local_58._0_4_;
      if (local_58._0_4_ != 0) {
        switch(info.byteOffset) {
        case 0:
          VVar3 = ValueType::GetInt(false);
          CreateLoadConstInstrForType<int,IR::IntConstOpnd,IRBuilderAsmJs::BuildConstantLoads()::__0>
                    (this,(byte *)table_00,(RegSlot *)((long)&table + 4),constCount,byteOffset,
                     TyInt32,VVar3,Ld_I4,extraProcess);
          break;
        case 1:
          VVar3 = ValueType::GetInt(false);
          CreateLoadConstInstrForType<long,IR::Int64ConstOpnd,IRBuilderAsmJs::BuildConstantLoads()::__1>
                    (this,table_00,(long)&table + 4,constCount,byteOffset,4,VVar3.field_0,0x1e4);
          break;
        case 2:
          CreateLoadConstInstrForType<float,IR::Float32ConstOpnd,IRBuilderAsmJs::BuildConstantLoads()::__2>
                    (this,(byte *)table_00,(RegSlot *)((long)&table + 4),local_58._0_4_,
                     info.tmpCount,TyFloat32,ValueType::Float,LdC_F8_R8,extraProcess);
          break;
        case 3:
          CreateLoadConstInstrForType<double,IR::FloatConstOpnd,IRBuilderAsmJs::BuildConstantLoads()::__3>
                    (this,(byte *)table_00,(RegSlot *)((long)&table + 4),local_58._0_4_,
                     info.tmpCount,TyFloat64,ValueType::Float,LdC_F8_R8,extraProcess);
          break;
        case 4:
          CreateLoadConstInstrForType<_SIMDValue,IR::Simd128ConstOpnd,IRBuilderAsmJs::BuildConstantLoads()::__4>
                    (this,(byte *)table_00,(RegSlot *)((long)&table + 4),local_58._0_4_,
                     info.tmpCount,TySimd128F4,ValueType::UninitializedObject,Simd128_LdC,
                     extraProcess);
          break;
        default:
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                             ,0x3ab,"(false)","false");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 0;
        }
      }
    }
  }
  return;
}

Assistant:

void
IRBuilderAsmJs::BuildConstantLoads()
{
    Js::Var * constTable = (Js::Var *)m_func->GetJITFunctionBody()->GetConstTable();
    // Load FrameDisplay
    IR::RegOpnd * asmJsEnvDstOpnd = BuildDstOpnd(AsmJsRegSlots::ModuleMemReg, TyVar);
    IR::Instr * ldAsmJsEnvInstr = IR::Instr::New(Js::OpCode::LdAsmJsEnv, asmJsEnvDstOpnd, m_func);
    AddInstr(ldAsmJsEnvInstr, Js::Constants::NoByteCodeOffset);
    // Load heap buffer
    if (m_asmFuncInfo->UsesHeapBuffer())
    {
        BuildHeapBufferReload(Js::Constants::NoByteCodeOffset, true);
    }
    if (!constTable)
    {
        return;
    }

    uint32 regAllocated = AsmJsRegSlots::RegCount;
    byte* table = (byte*)constTable;
    const bool isOOPJIT = m_func->IsOOPJIT();
    for (int i = 0; i < WAsmJs::LIMIT; ++i)
    {
        WAsmJs::Types type = (WAsmJs::Types)i;
        WAsmJs::TypedSlotInfo info = m_asmFuncInfo->GetTypedSlotInfo(type);
        if (info.constCount == 0)
        {
            continue;
        }

        switch(type)
        {
        case WAsmJs::INT32:
            CreateLoadConstInstrForType<int32, IR::IntConstOpnd>(
                table,
                regAllocated,
                info.constCount,
                info.constSrcByteOffset,
                TyInt32,
                ValueType::GetInt(false),
                Js::OpCode::Ld_I4,
                [isOOPJIT](IR::Instr* instr, int32 val)
                {
                    IR::RegOpnd* dstOpnd = instr->GetDst()->AsRegOpnd();
                    if (!isOOPJIT && dstOpnd->m_sym->IsSingleDef())
                    {
                        dstOpnd->m_sym->SetIsIntConst(val);
                    }
                }
            );
            break;
#if TARGET_64
        case WAsmJs::INT64:
            CreateLoadConstInstrForType<int64, IR::Int64ConstOpnd>(
                table,
                regAllocated,
                info.constCount,
                info.constSrcByteOffset,
                TyInt64,
                ValueType::GetInt(false),
                Js::OpCode::Ld_I4,
                [&](IR::Instr* instr, int64 val) {}
            );
            break;
#endif
        case WAsmJs::FLOAT32:
            CreateLoadConstInstrForType<float, IR::Float32ConstOpnd>(
                table,
                regAllocated,
                info.constCount,
                info.constSrcByteOffset,
                TyFloat32,
                ValueType::Float,
                Js::OpCode::LdC_F8_R8,
                [isOOPJIT](IR::Instr* instr, float val)
            {
#if _M_IX86
                IR::RegOpnd* dstOpnd = instr->GetDst()->AsRegOpnd();
                if (!isOOPJIT && dstOpnd->m_sym->IsSingleDef())
                {
                    dstOpnd->m_sym->SetIsFloatConst();
                }
#endif
            }
            );
            break;
        case WAsmJs::FLOAT64:
            CreateLoadConstInstrForType<double, IR::FloatConstOpnd>(
                table,
                regAllocated,
                info.constCount,
                info.constSrcByteOffset,
                TyFloat64,
                ValueType::Float,
                Js::OpCode::LdC_F8_R8,
                [isOOPJIT](IR::Instr* instr, double val)
                {
#if _M_IX86
                    IR::RegOpnd* dstOpnd = instr->GetDst()->AsRegOpnd();
                    if (!isOOPJIT && dstOpnd->m_sym->IsSingleDef())
                    {
                        dstOpnd->m_sym->SetIsFloatConst();
                    }
#endif
                }
            );
            break;
        case WAsmJs::SIMD:
            CreateLoadConstInstrForType<AsmJsSIMDValue, IR::Simd128ConstOpnd>(
                table,
                regAllocated,
                info.constCount,
                info.constSrcByteOffset,
                TySimd128F4,
                ValueType::UninitializedObject,
                Js::OpCode::Simd128_LdC,
                [isOOPJIT](IR::Instr* instr, AsmJsSIMDValue val)
                {
#if _M_IX86
                    IR::RegOpnd* dstOpnd = instr->GetDst()->AsRegOpnd();
                    if (!isOOPJIT && dstOpnd->m_sym->IsSingleDef())
                    {
                        dstOpnd->m_sym->SetIsSimd128Const();
                    }
#endif
                }
            );
            break;
        default:
            Assert(false);
            break;
        }
    }
}